

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

TStatus luaE_resetthread(lua_State *L,TStatus status)

{
  TStatus errcode;
  TStatus local_11;
  TStatus status_local;
  lua_State *L_local;
  
  resetCI(L);
  local_11 = status;
  if (status == '\x01') {
    local_11 = '\0';
  }
  errcode = luaD_closeprotected(L,1,local_11);
  if (errcode == '\0') {
    (L->top).p = (StkId)((L->stack).offset + 0x10);
  }
  else {
    luaD_seterrorobj(L,errcode,(StkId)((L->stack).offset + 0x10));
  }
  luaD_reallocstack(L,(int)((long)(L->ci->top).p - (L->stack).offset >> 4),0);
  return errcode;
}

Assistant:

TStatus luaE_resetthread (lua_State *L, TStatus status) {
  resetCI(L);
  if (status == LUA_YIELD)
    status = LUA_OK;
  status = luaD_closeprotected(L, 1, status);
  if (status != LUA_OK)  /* errors? */
    luaD_seterrorobj(L, status, L->stack.p + 1);
  else
    L->top.p = L->stack.p + 1;
  luaD_reallocstack(L, cast_int(L->ci->top.p - L->stack.p), 0);
  return status;
}